

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.c
# Opt level: O0

int fec_decode(fec_t *fec,gf *pkts,uint *idxs,uint len)

{
  gf c;
  long lVar1;
  uint k;
  uint *idxs_00;
  int iVar2;
  gf *pgVar3;
  ulong __n;
  gf *b;
  undefined8 uStack_70;
  gf agStack_68 [8];
  gf *local_60;
  uint local_54;
  gf *pgStack_50;
  uint col;
  gf *pkt;
  uint row;
  unsigned_long __vla_expr0;
  uint local_2c;
  uint *puStack_28;
  uint len_local;
  uint *idxs_local;
  gf *pkts_local;
  fec_t *fec_local;
  
  local_2c = len;
  puStack_28 = idxs;
  idxs_local = (uint *)pkts;
  pkts_local = (gf *)fec;
  if (fec == (fec_t *)0x0) {
    uStack_70 = 0x10a55f;
    __assert_fail("fec != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec.c",0xcd,
                  "int fec_decode(fec_t *, gf *, unsigned int *, unsigned int)");
  }
  uStack_70 = 0x10a56c;
  iVar2 = fec_shuffle(fec,idxs);
  pgVar3 = pkts_local;
  idxs_00 = puStack_28;
  if (iVar2 == 0) {
    fec_local._4_4_ = 0;
  }
  else {
    _row = (ulong)(uint)(*(int *)pkts_local * *(int *)pkts_local);
    lVar1 = -(_row + 0xf & 0xfffffffffffffff0);
    local_60 = agStack_68 + lVar1;
    __vla_expr0 = (unsigned_long)agStack_68;
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10a5b6;
    iVar2 = fec_decode_matrix((fec_t *)pgVar3,agStack_68 + lVar1,idxs_00);
    if (iVar2 == 0) {
      fec_local._4_4_ = 0;
    }
    else {
      for (pkt._0_4_ = 0; (uint)pkt < *(uint *)pkts_local; pkt._0_4_ = (uint)pkt + 1) {
        if (*(uint *)pkts_local <= puStack_28[(uint)pkt]) {
          pgVar3 = (gf *)((long)idxs_local + (ulong)((uint)pkt * local_2c));
          __n = (ulong)local_2c;
          pgStack_50 = pgVar3;
          *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10a622;
          memset(pgVar3,0,__n);
          for (local_54 = 0; k = local_2c, pgVar3 = pgStack_50, local_54 < *(uint *)pkts_local;
              local_54 = local_54 + 1) {
            b = (gf *)((long)idxs_local + (ulong)(puStack_28[local_54] * local_2c));
            c = local_60[(uint)pkt * *(int *)pkts_local + local_54];
            *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10a670;
            gf_add_mul(pgVar3,b,c,k);
          }
        }
      }
      fec_local._4_4_ = 1;
    }
  }
  return fec_local._4_4_;
}

Assistant:

int fec_decode(fec_t *fec,
               gf *pkts,
               unsigned int idxs[], unsigned len) {
  assert(fec != NULL);
  
  if (!fec_shuffle(fec, idxs))
    return 0;

  /*M
    Build decoding matrix.
  **/
  gf dec_matrix[fec->k * fec->k];
  if (!fec_decode_matrix(fec, dec_matrix, idxs))
    return 0;

  unsigned int row;
  for (row = 0; row < fec->k; row++) {
    if (idxs[row] >= fec->k) {
      gf *pkt = pkts + row * len;
      
      bzero(pkt, len * sizeof(gf));
      unsigned int col;
      for (col = 0; col < fec->k; col++) {
        gf_add_mul(pkt, pkts + idxs[col] * len,
                   dec_matrix[row * fec->k + col], len);
      }
    }
  }

  return 1;
}